

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O3

void CompilationContext::globalError(char *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  value_type local_80;
  
  if (errorLevel < 4) {
    errorLevel = 4;
  }
  if (redirectMessagesToJson == (char *)0x0) {
    fprintf((FILE *)out_stream,"ERROR: %s\n",error);
  }
  paVar1 = &local_80.message.field_2;
  local_80.message._M_string_length = 0;
  local_80.message.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_80.fileName.field_2;
  local_80.fileName._M_string_length = 0;
  local_80.fileName.field_2._M_local_buf[0] = '\0';
  local_80.textId = "";
  local_80.line = 0;
  local_80.column = 0;
  local_80.intId = 0;
  local_80.isError = true;
  local_80.message._M_dataplus._M_p = (pointer)paVar1;
  local_80.fileName._M_dataplus._M_p = (pointer)paVar2;
  strlen(error);
  std::__cxx11::string::_M_replace((ulong)&local_80.message,0,(char *)0x0,(ulong)error);
  std::__cxx11::string::_M_replace
            ((ulong)&local_80.fileName,0,(char *)local_80.fileName._M_string_length,0x12ca96);
  std::vector<CompilerMessage,_std::allocator<CompilerMessage>_>::push_back
            (&compilerMessages,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.fileName._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.fileName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.message._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilationContext::globalError(const char * error)
{
  CompilationContext::setErrorLevel(ERRORLEVEL_FATAL);

  if (!redirectMessagesToJson)
    fprintf(out_stream, "ERROR: %s\n", error);

  CompilerMessage cm;
  cm.line = 0;
  cm.column = 0;
  cm.intId = 0;
  cm.isError = true;
  cm.message = error;
  cm.fileName = "";
  compilerMessages.push_back(cm);
}